

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Region * __thiscall
FlowGraph::PropagateRegionFromPred
          (FlowGraph *this,BasicBlock *block,BasicBlock *predBlock,Region *predRegion,
          Instr **tryInstr)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  IRKind IVar4;
  RegionType RVar5;
  bool bVar6;
  Instr *pIVar7;
  LabelInstr *this_00;
  LabelInstr *pLVar8;
  BranchInstr *pBVar9;
  Region *pRVar10;
  Region *pRVar11;
  undefined4 *puVar12;
  bool local_89;
  bool local_73;
  LabelInstr *tryInstrNext;
  Region *tryRegion;
  Instr *firstInstr;
  Instr *predLastInstr;
  Region *region;
  Instr **tryInstr_local;
  Region *predRegion_local;
  BasicBlock *predBlock_local;
  BasicBlock *block_local;
  FlowGraph *this_local;
  
  predLastInstr = (Instr *)0x0;
  pIVar7 = BasicBlock::GetLastInstr(predBlock);
  this_00 = (LabelInstr *)BasicBlock::GetFirstInstr(block);
  pRVar11 = predRegion;
  if (pIVar7 != (Instr *)0x0) {
    OVar1 = pIVar7->m_opcode;
    if (OVar1 == TryCatch) {
      pIVar2 = pIVar7->m_next;
      IVar4 = IR::Instr::GetKind(pIVar2);
      local_73 = true;
      if (IVar4 != InstrKindLabel) {
        local_73 = IR::Instr::IsProfiledLabelInstr(pIVar2);
      }
      if (local_73 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x7e4,"(predLastInstr->m_next->IsLabelInstr())",
                           "predLastInstr->m_next->IsLabelInstr()");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pLVar8 = IR::Instr::AsLabelInstr(pIVar7->m_next);
      pRVar10 = IR::LabelInstr::GetRegion(pLVar8);
      pBVar9 = IR::Instr::AsBranchInstr(pIVar7);
      pLVar8 = IR::BranchInstr::GetTarget(pBVar9);
      if (this_00 == pLVar8) {
        pRVar11 = Region::New(RegionTypeCatch,predRegion,this->func);
        if (pRVar10 == (Region *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7eb,"(tryRegion)","tryRegion");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        Region::SetMatchingTryRegion(pRVar11,pRVar10);
        Region::SetMatchingCatchRegion(pRVar10,pRVar11);
      }
      else {
        pRVar11 = Region::New(RegionTypeTry,predRegion,this->func);
        *tryInstr = pIVar7;
      }
    }
    else if (OVar1 == TryFinally) {
      pIVar2 = pIVar7->m_next;
      IVar4 = IR::Instr::GetKind(pIVar2);
      local_89 = true;
      if (IVar4 != InstrKindLabel) {
        local_89 = IR::Instr::IsProfiledLabelInstr(pIVar2);
      }
      if (local_89 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x7f9,"(predLastInstr->m_next->IsLabelInstr())",
                           "predLastInstr->m_next->IsLabelInstr()");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pLVar8 = IR::Instr::AsLabelInstr(pIVar7->m_next);
      pRVar10 = IR::LabelInstr::GetRegion(pLVar8);
      pBVar9 = IR::Instr::AsBranchInstr(pIVar7);
      pLVar8 = IR::BranchInstr::GetTarget(pBVar9);
      if (this_00 == pLVar8) {
        if ((pRVar10 == (Region *)0x0) || (RVar5 = Region::GetType(pRVar10), RVar5 != RegionTypeTry)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7ff,
                             "(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)",
                             "tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pRVar11 = Region::New(RegionTypeFinally,predRegion,this->func);
        Region::SetMatchingTryRegion(pRVar11,pRVar10);
        Region::SetMatchingFinallyRegion(pRVar10,pRVar11,true);
        *tryInstr = pIVar7;
      }
      else {
        pRVar11 = Region::New(RegionTypeTry,predRegion,this->func);
        *tryInstr = pIVar7;
      }
    }
    else if (OVar1 == LeaveNull) {
      pRVar11 = Region::GetParent(predRegion);
      if (pRVar11 == (Region *)0x0) {
        bVar6 = Func::IsLoopBodyInTry(this->func);
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x82a,"(this->func->IsLoopBodyInTry())",
                             "this->func->IsLoopBodyInTry()");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pBVar9 = IR::Instr::AsBranchInstr(pIVar7);
        pBVar9->field_0x58 = pBVar9->field_0x58 & 0xfb | 4;
        pRVar11 = predRegion;
      }
    }
    else if (OVar1 == Leave) {
      if (((this_00->super_Instr).m_next == (Instr *)0x0) ||
         (((this_00->super_Instr).m_next)->m_opcode != Finally)) {
        pRVar11 = Region::GetParent(predRegion);
        if (pRVar11 == (Region *)0x0) {
          bVar6 = Func::IsLoopBodyInTry(this->func);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x81e,"(this->func->IsLoopBodyInTry())",
                               "this->func->IsLoopBodyInTry()");
            if (!bVar6) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          pBVar9 = IR::Instr::AsBranchInstr(pIVar7);
          pBVar9->field_0x58 = pBVar9->field_0x58 & 0xfb | 4;
          pRVar11 = predRegion;
        }
      }
      else {
        pRVar11 = Region::GetMatchingFinallyRegion(predRegion,true);
        if (pRVar11 == (Region *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x810,"(tryRegion->GetMatchingFinallyRegion(true) != nullptr)",
                             "tryRegion->GetMatchingFinallyRegion(true) != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pRVar11 = Region::GetParent(predRegion);
        pRVar11 = Region::New(RegionTypeFinally,pRVar11,this->func);
        if ((predRegion == (Region *)0x0) ||
           (RVar5 = Region::GetType(predRegion), RVar5 != RegionTypeTry)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x812,
                             "(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)",
                             "tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        Region::SetMatchingTryRegion(pRVar11,predRegion);
        Region::SetMatchingFinallyRegion(predRegion,pRVar11,false);
      }
    }
    else if (OVar1 == BrOnException) {
      RVar5 = Region::GetType(predRegion);
      pRVar11 = predRegion;
      if ((RVar5 != RegionTypeFinally) &&
         (pIVar7 = IR::Instr::GetNextRealInstr((Instr *)this_00), pRVar11 = predRegion,
         pIVar7->m_opcode == LeaveNull)) {
        pRVar11 = Region::GetParent(predRegion);
      }
    }
    else {
      pRVar11 = predRegion;
      if (((OVar1 == BailOnException) &&
          (pRVar11 = (Region *)predLastInstr, (this_00->super_Instr).m_next != (Instr *)0x0)) &&
         (((this_00->super_Instr).m_next)->m_opcode == Finally)) {
        pRVar10 = Region::GetMatchingTryRegion(predRegion);
        pRVar11 = Region::GetParent(predRegion);
        pRVar11 = Region::New(RegionTypeFinally,pRVar11,this->func);
        if ((pRVar10 == (Region *)0x0) || (RVar5 = Region::GetType(pRVar10), RVar5 != RegionTypeTry)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x835,
                             "(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)",
                             "tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        Region::SetMatchingTryRegion(pRVar11,pRVar10);
        Region::SetMatchingFinallyRegion(pRVar10,pRVar11,false);
      }
    }
  }
  predLastInstr = (Instr *)pRVar11;
  return (Region *)predLastInstr;
}

Assistant:

Region *
FlowGraph::PropagateRegionFromPred(BasicBlock * block, BasicBlock * predBlock, Region * predRegion, IR::Instr * &tryInstr)
{
    // Propagate predRegion to region, looking at the flow transition for an opcode
    // that affects the region.
    Region * region = nullptr;
    IR::Instr * predLastInstr = predBlock->GetLastInstr();
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (predLastInstr == nullptr)
    {
        // Empty block: trivially propagate the region.
        region = predRegion;
    }
    else
    {
        Region * tryRegion = nullptr;
        IR::LabelInstr * tryInstrNext = nullptr;
        switch (predLastInstr->m_opcode)
        {
        case Js::OpCode::TryCatch:
            // Entry to a try-catch. See whether we're entering the try or the catch
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                region = Region::New(RegionTypeCatch, predRegion, this->func);
                Assert(tryRegion);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingCatchRegion(region);
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::TryFinally:
            // Entry to a try-finally. See whether we're entering the try or the finally
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region = Region::New(RegionTypeFinally, predRegion, this->func);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, true);
                tryInstr = predLastInstr;
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::Leave:
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion;
                Assert(tryRegion->GetMatchingFinallyRegion(true) != nullptr);
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
                break;
            }

            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::LeaveNull:
            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::BailOnException:
            // Infinite loop, no edge to non excepting finally
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion->GetMatchingTryRegion();
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
            }
            break;
        case Js::OpCode::BrOnException:
            // Infinite loop inside another EH region within finally,
            // We have added edges for all infinite loops inside a finally, identify that and transition to parent
            if (predRegion->GetType() != RegionTypeFinally && firstInstr->GetNextRealInstr()->m_opcode == Js::OpCode::LeaveNull)
            {
                region = predRegion->GetParent();
            }
            else
            {
                region = predRegion;
            }
            break;
        default:
            // Normal (non-EH) transition: just propagate the region.
            region = predRegion;
            break;
        }
    }
    return region;
}